

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::ProfiledNewScFltArray<true>
          (InterpreterStackFrame *this,OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout)

{
  ProfileId index;
  uint offset;
  code *pcVar1;
  bool bVar2;
  FunctionBody *pFVar3;
  AuxArray<double> *doubles_00;
  DynamicProfileInfo *this_00;
  ArrayCallSiteInfo *this_01;
  undefined4 *puVar4;
  Recycler *this_02;
  RecyclerWeakReference<Js::FunctionBody> *weakRef;
  JavascriptLibrary *pJVar5;
  SparseArraySegmentBase *pSVar6;
  Var ptr;
  uint local_64;
  uint i;
  SparseArraySegment<void_*> *segment_1;
  Recycler *recycler;
  JavascriptNativeFloatArray *floatArray;
  SparseArraySegment<double> *segment;
  JavascriptArray *arr;
  ArrayCallSiteInfo *arrayInfo;
  FunctionBody *functionBody;
  ProfileId profileId;
  AuxArray<double> *doubles;
  OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = (playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset;
  pFVar3 = GetFunctionBody(this);
  doubles_00 = ByteCodeReader::ReadAuxArray<double>(offset,pFVar3);
  index = playout->profileId;
  pFVar3 = *(FunctionBody **)(this + 0x88);
  this_00 = FunctionBody::GetDynamicProfileInfo(pFVar3);
  this_01 = DynamicProfileInfo::GetArrayCallSiteInfo(this_00,pFVar3,index);
  if (this_01 == (ArrayCallSiteInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1584,"(arrayInfo)","arrayInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this_01 == (ArrayCallSiteInfo *)0x0) ||
     (bVar2 = ArrayCallSiteInfo::IsNativeFloatArray(this_01), !bVar2)) {
    pJVar5 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
    segment = (SparseArraySegment<double> *)
              JavascriptLibrary::CreateArrayLiteral(pJVar5,doubles_00->count);
    pSVar6 = Js::JavascriptArray::GetHead((JavascriptArray *)segment);
    for (local_64 = 0; local_64 < doubles_00->count; local_64 = local_64 + 1) {
      ptr = JavascriptNumber::ToVarNoCheck
                      ((double)doubles_00[(ulong)local_64 + 1],*(ScriptContext **)(this + 0x78));
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)(&pSVar6[1].left + (ulong)local_64 * 2),ptr);
    }
  }
  else {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(this_01);
    pJVar5 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
    segment = (SparseArraySegment<double> *)
              JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar5,doubles_00->count);
    pSVar6 = Js::JavascriptArray::GetHead((JavascriptArray *)segment);
    Js::JavascriptOperators::AddFloatsToArraySegment
              ((SparseArraySegment<double> *)pSVar6,doubles_00);
    this_02 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
    weakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionBody>(this_02,pFVar3);
    JavascriptNativeArray::SetArrayCallSite((JavascriptNativeArray *)segment,index,weakRef);
  }
  Js::JavascriptArray::CheckForceES5Array((JavascriptArray *)segment);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,segment);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScFltArray(const unaligned OpLayoutDynamicProfile<OpLayoutAuxiliary> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScFltArray(playout);
            return;
        }

        const Js::AuxArray<double> *doubles = Js::ByteCodeReader::ReadAuxArray<double>(playout->Offset, this->GetFunctionBody());

        Js::ProfileId  profileId = playout->profileId;
        FunctionBody *functionBody = this->m_functionBody;
        ArrayCallSiteInfo *arrayInfo = functionBody->GetDynamicProfileInfo()->GetArrayCallSiteInfo(functionBody, profileId);
        Assert(arrayInfo);

        JavascriptArray *arr;
        if (arrayInfo && arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(doubles->count);
            SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();
            JavascriptOperators::AddFloatsToArraySegment(segment, doubles);

            JavascriptNativeFloatArray *floatArray = reinterpret_cast<JavascriptNativeFloatArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            floatArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else
        {
            arr = scriptContext->GetLibrary()->CreateArrayLiteral(doubles->count);
            SparseArraySegment<Var> * segment = (SparseArraySegment<Var>*)arr->GetHead();
            for (uint i = 0; i < doubles->count; i++)
            {
                segment->elements[i] = JavascriptNumber::ToVarNoCheck(doubles->elements[i], scriptContext);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }